

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall Runtime::Runtime(Runtime *this,Instance *inst,Statistics *stats)

{
  size_type __n;
  allocator_type *__a;
  undefined8 in_RDX;
  long in_RDI;
  QpVector *this_00;
  Settings *in_stack_ffffffffffffff60;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *this_01;
  undefined8 in_stack_ffffffffffffff88;
  HighsInt d;
  Instance *in_stack_ffffffffffffff90;
  Instance *in_stack_ffffffffffffff98;
  Instance *in_stack_ffffffffffffffa0;
  vector<BasisStatus,_std::allocator<BasisStatus>_> local_25;
  
  local_25.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
  super__Vector_impl_data._13_8_ = in_RDX;
  Instance::Instance(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Instance::Instance(in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff88);
  Instance::Instance(in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff88);
  Instance::Instance(in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff88);
  d = (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  Settings::Settings(in_stack_ffffffffffffff60);
  *(undefined8 *)(in_RDI + 0x8d8) =
       local_25.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
       super__Vector_impl_data._13_8_;
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff90,d);
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff90,d);
  this_00 = (QpVector *)(in_RDI + 0x950);
  QpVector::QpVector(this_00,d);
  QpVector::QpVector(this_00,(HighsInt)((ulong)(in_RDI + 0x988) >> 0x20));
  *(undefined4 *)(in_RDI + 0x9c0) = 1;
  __a = (allocator_type *)(in_RDI + 0x9c8);
  __n = (size_type)*(int *)(in_RDI + 4);
  this_01 = &local_25;
  std::allocator<BasisStatus>::allocator((allocator<BasisStatus> *)0x74c34b);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector(this_01,__n,__a);
  std::allocator<BasisStatus>::~allocator((allocator<BasisStatus> *)0x74c36e);
  std::allocator<BasisStatus>::allocator((allocator<BasisStatus> *)0x74c39c);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector(this_01,__n,__a);
  std::allocator<BasisStatus>::~allocator((allocator<BasisStatus> *)0x74c3be);
  return;
}

Assistant:

Runtime(Instance& inst, Statistics& stats)
      : instance(inst),
        statistics(stats),
        primal(QpVector(instance.num_var)),
        rowactivity(QpVector(instance.num_con)),
        dualvar(instance.num_var),
        dualcon(instance.num_con),
        status_var(instance.num_var),
        status_con(instance.num_con) {}